

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqNull_Test<char>::Body
          (iu_StrCaseTest_x_iutest_x_EqNull_Test<char> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5c8;
  Fixed local_598;
  undefined1 local_410 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3b8;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1c8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam *p;
  iu_StrCaseTest_x_iutest_x_EqNull_Test<char> *this_local;
  
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASEEQ
            ((AssertionResult *)local_40,"__null","p",(char *)0x0,(char *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x97,pcVar2,kWarning);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASEEQ
            ((AssertionResult *)local_230,"__null","p",(char *)0x0,(char *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3b8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3b8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x98,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3b8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3b8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperSTRCASEEQ
            ((AssertionResult *)local_410,"__null","p",(char *)0x0,(char *)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    memset(&local_598,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_598);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_410);
    iutest::AssertionHelper::AssertionHelper
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x99,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_5c8,&local_598);
    iutest::AssertionHelper::~AssertionHelper(&local_5c8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_598);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, EqNull)
{
    TypeParam* p=NULL;
    IUTEST_INFORM_STRCASEEQ(NULL, p);
    IUTEST_EXPECT_STRCASEEQ(NULL, p);
    IUTEST_ASSERT_STRCASEEQ(NULL, p);
}